

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabColumn(sqlite3_vtab_cursor *pVtabCursor,sqlite3_context *ctx,int i)

{
  sqlite3_value *pValue;
  PragmaVtab *pTab;
  PragmaVtabCursor *pCsr;
  int i_local;
  sqlite3_context *ctx_local;
  sqlite3_vtab_cursor *pVtabCursor_local;
  
  if (i < (int)(uint)*(byte *)((long)&pVtabCursor->pVtab[1].zErrMsg + 1)) {
    pValue = sqlite3_column_value((sqlite3_stmt *)pVtabCursor[1].pVtab,i);
    sqlite3_result_value(ctx,pValue);
  }
  else {
    sqlite3_result_text(ctx,(char *)pVtabCursor
                                    [(long)(int)(i - (uint)*(byte *)((long)&pVtabCursor->pVtab[1].
                                                                            zErrMsg + 1)) + 3].pVtab
                        ,-1,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return 0;
}

Assistant:

static int pragmaVtabColumn(
  sqlite3_vtab_cursor *pVtabCursor, 
  sqlite3_context *ctx, 
  int i
){
  PragmaVtabCursor *pCsr = (PragmaVtabCursor*)pVtabCursor;
  PragmaVtab *pTab = (PragmaVtab*)(pVtabCursor->pVtab);
  if( i<pTab->iHidden ){
    sqlite3_result_value(ctx, sqlite3_column_value(pCsr->pPragma, i));
  }else{
    sqlite3_result_text(ctx, pCsr->azArg[i-pTab->iHidden],-1,SQLITE_TRANSIENT);
  }
  return SQLITE_OK;
}